

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

void hook_quit(char *str)

{
  long lVar1;
  term *t;
  term_data *td;
  wchar_t i;
  char *str_local;
  
  save_prefs();
  for (td._4_4_ = L'\0'; td._4_4_ < term_windows_open; td._4_4_ = td._4_4_ + L'\x01') {
    lVar1 = (long)td._4_4_;
    XFree(data[lVar1].sizeh);
    XFree(data[lVar1].classh);
    Infofnt = data[lVar1].fnt;
    Infofnt_nuke();
    mem_free(data[lVar1].fnt);
    Infowin = data[lVar1].win;
    Infowin_nuke();
    mem_free(data[lVar1].win);
    term_nuke(&data[lVar1].t);
  }
  Infoclr = xor;
  Infoclr_nuke();
  mem_free(xor);
  for (td._4_4_ = 0; td._4_4_ < 0x60; td._4_4_ = td._4_4_ + 1) {
    Infoclr = clr[td._4_4_];
    Infoclr_nuke();
    mem_free(clr[td._4_4_]);
  }
  Metadpy_nuke();
  return;
}

Assistant:

static void hook_quit(const char *str)
{
	int i;

	/* Unused */
	(void)str;

	save_prefs();

	/* Free allocated data */
	for (i = 0; i < term_windows_open; i++) {
		term_data *td = &data[i];
		term *t = &td->t;

		/* Free size hints */
		XFree(td->sizeh);

		/* Free class hints */
		XFree(td->classh);

		/* Free fonts */
		Infofnt_set(td->fnt);
		(void)Infofnt_nuke();
		mem_free(td->fnt);

		/* Free window */
		Infowin_set(td->win);
		(void)Infowin_nuke();
		mem_free(td->win);

		/* Free term */
		(void)term_nuke(t);
	}

	/* Free colors */
	Infoclr_set(xor);
	(void)Infoclr_nuke();
	mem_free(xor);

	for (i = 0; i < MAX_COLORS * BG_MAX; ++i) {
		Infoclr_set(clr[i]);
		(void)Infoclr_nuke();
		mem_free(clr[i]);
	}

	/* Close link to display */
	(void)Metadpy_nuke();
}